

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodDescriptorProto::SharedDtor(MethodDescriptorProto *this)

{
  string *psVar1;
  MethodDescriptorProto *this_local;
  
  if ((this->name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->name_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->input_type_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->input_type_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->output_type_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->output_type_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this != default_instance_) && (this->options_ != (MethodOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void MethodDescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (input_type_ != &::google::protobuf::internal::kEmptyString) {
    delete input_type_;
  }
  if (output_type_ != &::google::protobuf::internal::kEmptyString) {
    delete output_type_;
  }
  if (this != default_instance_) {
    delete options_;
  }
}